

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

span<const_long,_18446744073709551615UL> __thiscall
lf::assemble::DynamicFEDofHandler::InteriorGlobalDofIndices
          (DynamicFEDofHandler *this,Entity *entity)

{
  uint uVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  dim_t dVar5;
  uint uVar6;
  uint uVar7;
  element_type *peVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  const_reference this_00;
  long *plVar11;
  gdof_idx_t *end;
  gdof_idx_t *begin;
  size_type no_loc_dofs;
  size_type no_covered_dofs;
  size_type idx_offset;
  glb_idx_t entity_index;
  dim_t codim;
  RefEl ref_el_type;
  Entity *entity_local;
  DynamicFEDofHandler *this_local;
  
  _codim = entity;
  iVar4 = (*entity->_vptr_Entity[4])();
  entity_index._3_1_ = (undefined1)iVar4;
  dVar5 = lf::base::RefEl::Dimension((RefEl *)((long)&entity_index + 3));
  uVar6 = 2 - dVar5;
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  uVar7 = (*peVar8->_vptr_Mesh[5])(peVar8,_codim);
  pvVar9 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->offsets_,(ulong)uVar6);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (pvVar9,(ulong)uVar7);
  uVar1 = *pvVar10;
  pvVar9 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->offsets_,(ulong)uVar6);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (pvVar9,(ulong)(uVar7 + 1));
  vVar2 = *pvVar10;
  pvVar9 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->num_int_dofs_,(ulong)uVar6);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (pvVar9,(ulong)uVar7);
  vVar3 = *pvVar10;
  this_00 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                      (&this->dofs_,(ulong)uVar6);
  plVar11 = std::vector<long,_std::allocator<long>_>::data(this_00);
  std::span<const_long,_18446744073709551615UL>::span<const_long_*,_const_long_*>
            ((span<const_long,_18446744073709551615UL> *)&this_local,
             plVar11 + (ulong)uVar1 + (ulong)((vVar2 - uVar1) - vVar3),
             plVar11 + (ulong)uVar1 + (ulong)(vVar2 - uVar1));
  return _this_local;
}

Assistant:

std::span<const gdof_idx_t> DynamicFEDofHandler::InteriorGlobalDofIndices(
    const lf::mesh::Entity &entity) const {
  // Topological type
  const lf::base::RefEl ref_el_type = entity.RefEl();
  // Co-dimension of entity in a 2D mesh
  const dim_t codim = 2 - ref_el_type.Dimension();
  // Index of current mesh entity
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  // Offset of indices for current entity
  const size_type idx_offset = offsets_[codim][entity_index];
  // Number of shape functions covering current entity
  const size_type no_covered_dofs =
      offsets_[codim][entity_index + 1] - idx_offset;
  // Number of shape functions associated with the current entity
  const size_type no_loc_dofs = num_int_dofs_[codim][entity_index];
  // Pointers to range of dof indices
  const gdof_idx_t *begin = dofs_[codim].data() + idx_offset;
  const gdof_idx_t *end = begin + no_covered_dofs;
  // Move pointer to location of indices for interior dofs
  // This is the only difference to GlobalDofIndices()
  begin += (no_covered_dofs - no_loc_dofs);
  return {begin, end};
}